

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O2

void __thiscall
vkt::tessellation::anon_unknown_2::IdentityTessellationShaderTestCase::initPrograms
          (IdentityTessellationShaderTestCase *this,SourceCollections *programCollection)

{
  TessPrimitiveType TVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ProgramSources *pPVar5;
  allocator<char> local_202;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [40];
  ostringstream src;
  string local_190 [368];
  
  addVertexAndFragmentShaders(programCollection);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)&src,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"#extension GL_EXT_tessellation_shader : require\n");
  poVar4 = std::operator<<(poVar4,"layout(vertices = ");
  iVar2 = numVerticesPerPrimitive(this->m_primitiveType,false);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,") out;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) in  highp vec4 v_vertex_color[];\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) out highp vec4 v_control_color[];\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,
                           "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                          );
  poVar4 = std::operator<<(poVar4,
                           "    v_control_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n"
                          );
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelInner[0] = 1.0;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelInner[1] = 1.0;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[0] = 1.0;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[1] = 1.0;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[2] = 1.0;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[3] = 1.0;\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"tesc",&local_202);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_1c0,&local_200);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_1c0);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)&src,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"#extension GL_EXT_tessellation_shader : require\n");
  poVar4 = std::operator<<(poVar4,"layout(");
  if ((ulong)this->m_primitiveType < 3) {
    pcVar3 = *(char **)(&DAT_00bdbd98 + (ulong)this->m_primitiveType * 8);
  }
  else {
    pcVar3 = (char *)0x0;
  }
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,") in;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) in  highp vec4 v_control_color[];\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) out highp vec4 v_evaluated_color;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "// note: No need to use precise gl_Position since we do not require gapless geometry\n"
                          );
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  std::operator<<(poVar4,"{\n");
  if (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
    poVar4 = std::operator<<((ostream *)&src,
                             "    gl_Position = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);\n"
                            );
    pcVar3 = 
    "    v_evaluated_color = mix(v_control_color[0], v_control_color[1], gl_TessCoord.x);\n";
  }
  else {
    if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) goto LAB_00719e16;
    poVar4 = std::operator<<((ostream *)&src,
                             "    gl_Position = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n"
                            );
    pcVar3 = 
    "    v_evaluated_color = gl_TessCoord.x * v_control_color[0] + gl_TessCoord.y * v_control_color[1] + gl_TessCoord.z * v_control_color[2];\n"
    ;
  }
  std::operator<<(poVar4,pcVar3);
LAB_00719e16:
  std::operator<<((ostream *)&src,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"tese",&local_202);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_1c0,&local_200);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_1c0);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c0,"geom_from_tese",&local_202);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_1c0);
  TVar1 = this->m_primitiveType;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"v_evaluated_color",&local_201);
  generateGeometryShader(&local_1e0,TVar1,&local_200);
  glu::GeometrySource::GeometrySource((GeometrySource *)&src,&local_1e0);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&src);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c0,"geom_from_vert",&local_202);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_1c0);
  TVar1 = this->m_primitiveType;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"v_vertex_color",&local_201);
  generateGeometryShader(&local_1e0,TVar1,&local_200);
  glu::GeometrySource::GeometrySource((GeometrySource *)&src,&local_1e0);
  glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&src);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)local_1c0);
  return;
}

Assistant:

void IdentityTessellationShaderTestCase::initPrograms (vk::SourceCollections& programCollection) const
{
	addVertexAndFragmentShaders(programCollection);

	// Tessellation control
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "layout(vertices = " << numVerticesPerPrimitive(m_primitiveType, false) << ") out;\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec4 v_vertex_color[];\n"
			<< "layout(location = 0) out highp vec4 v_control_color[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< "    v_control_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n"
			<< "\n"
			<< "    gl_TessLevelInner[0] = 1.0;\n"
			<< "    gl_TessLevelInner[1] = 1.0;\n"
			<< "    gl_TessLevelOuter[0] = 1.0;\n"
			<< "    gl_TessLevelOuter[1] = 1.0;\n"
			<< "    gl_TessLevelOuter[2] = 1.0;\n"
			<< "    gl_TessLevelOuter[3] = 1.0;\n"
			<<	"}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "layout(" << getTessPrimitiveTypeShaderName(m_primitiveType) << ") in;\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec4 v_control_color[];\n"
			<< "layout(location = 0) out highp vec4 v_evaluated_color;\n"
			<< "\n"
			<< "// note: No need to use precise gl_Position since we do not require gapless geometry\n"
			<< "void main (void)\n"
			<< "{\n";

		if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			src << "    gl_Position = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n"
				<< "    v_evaluated_color = gl_TessCoord.x * v_control_color[0] + gl_TessCoord.y * v_control_color[1] + gl_TessCoord.z * v_control_color[2];\n";
		else if (m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
			src << "    gl_Position = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);\n"
				<< "    v_evaluated_color = mix(v_control_color[0], v_control_color[1], gl_TessCoord.x);\n";
		else
			DE_ASSERT(false);

		src << "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}

	// Geometry shader
	{
		programCollection.glslSources.add("geom_from_tese") << glu::GeometrySource(
			generateGeometryShader(m_primitiveType, "v_evaluated_color"));
		programCollection.glslSources.add("geom_from_vert") << glu::GeometrySource(
			generateGeometryShader(m_primitiveType, "v_vertex_color"));
	}
}